

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O0

void testProcrustesImp<float>(void)

{
  bool bVar1;
  float a;
  double dVar2;
  double dVar3;
  double dVar4;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *in_stack_000001b8;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *in_stack_000001c0;
  Eulerd rot2;
  Eulerd rot;
  size_t i_1;
  size_t numPoints;
  Rand48 random;
  float offset;
  float theta;
  size_t i;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> toPoints;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> fromPoints;
  M44d m;
  M44d id;
  value_type *in_stack_fffffffffffff848;
  Matrix44<double> *in_stack_fffffffffffff850;
  Vec3<float> *this;
  Matrix44<double> *in_stack_fffffffffffff858;
  undefined8 in_stack_fffffffffffff860;
  Vec3<float> *pVVar5;
  double in_stack_fffffffffffff868;
  double in_stack_fffffffffffff870;
  double in_stack_fffffffffffff878;
  Matrix44<double> *v;
  Euler<double> *in_stack_fffffffffffff880;
  M44d *in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff94c;
  Matrix44<double> *in_stack_fffffffffffff950;
  float local_698;
  Vec3<float> local_694;
  Euler<double> *in_stack_fffffffffffff978;
  Vec3<float> local_67c [11];
  Matrix44<double> local_5f0;
  Vec3<float> local_54c [2];
  M44d *in_stack_fffffffffffffad0;
  M44d *in_stack_fffffffffffffb20;
  Matrix44<double> local_4c0;
  Vec3<float> local_420;
  Vec3<float> local_414;
  Vec3<float> local_408;
  Vec3<float> local_3fc;
  ulong local_3f0;
  ulong local_3e8;
  Vec3<float> local_3d8 [2];
  Vec3<float> local_3bc;
  undefined4 local_3b0;
  float local_3ac;
  ulong local_3a8;
  Vec3<double> local_370;
  Vec3<double> local_358;
  Vec3<double> local_340;
  Vec3<double> local_328;
  Vec3<double> local_310;
  Vec3<double> local_2f8;
  Vec3<double> local_2e0;
  Vec3<double> local_2c8;
  Vec3<double> local_2b0;
  Vec3<double> local_298;
  Matrix44<double> local_280;
  Matrix44<double> local_200;
  Matrix44<double> local_180;
  Matrix44<double> local_100;
  Matrix44<double> local_80;
  
  Imath_3_2::procrustesRotationAndTranslation<float>
            ((Vec3 *)&local_80,(Vec3 *)0x0,(float *)0x0,0,false);
  Imath_3_2::Matrix44<double>::Matrix44(&local_100);
  bVar1 = Imath_3_2::Matrix44<double>::operator==(&local_80,&local_100);
  if (!bVar1) {
    __assert_fail("id == IMATH_INTERNAL_NAMESPACE::M44d ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                  ,299,"void testProcrustesImp() [T = float]");
  }
  Imath_3_2::procrustesRotationAndTranslation<float>((Vec3 *)&local_180,(Vec3 *)0x0,0,false);
  Imath_3_2::Matrix44<double>::operator=(&local_80,&local_180);
  Imath_3_2::Matrix44<double>::Matrix44(&local_200);
  bVar1 = Imath_3_2::Matrix44<double>::operator==(&local_80,&local_200);
  if (!bVar1) {
    __assert_fail("id == IMATH_INTERNAL_NAMESPACE::M44d ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                  ,0x131,"void testProcrustesImp() [T = float]");
  }
  Imath_3_2::Matrix44<double>::Matrix44(&local_280);
  Imath_3_2::Matrix44<double>::makeIdentity(&local_280);
  testTranslationRotationMatrix<float>(in_stack_fffffffffffffb20);
  Imath_3_2::Vec3<double>::Vec3(&local_298,3.0,5.0,-0.2);
  Imath_3_2::Matrix44<double>::translate<double>(&local_280,&local_298);
  testTranslationRotationMatrix<float>(in_stack_fffffffffffffb20);
  Imath_3_2::Vec3<double>::Vec3(&local_2b0,3.141592653589793,0.0,0.0);
  Imath_3_2::Matrix44<double>::rotate<double>
            (in_stack_fffffffffffff950,
             (Vec3<double> *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
  testTranslationRotationMatrix<float>(in_stack_fffffffffffffb20);
  Imath_3_2::Vec3<double>::Vec3(&local_2c8,0.0,0.7853981633974483,0.0);
  Imath_3_2::Matrix44<double>::rotate<double>
            (in_stack_fffffffffffff950,
             (Vec3<double> *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
  testTranslationRotationMatrix<float>(in_stack_fffffffffffffb20);
  Imath_3_2::Vec3<double>::Vec3(&local_2e0,0.0,0.0,-2.356194490192345);
  Imath_3_2::Matrix44<double>::rotate<double>
            (in_stack_fffffffffffff950,
             (Vec3<double> *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
  testTranslationRotationMatrix<float>(in_stack_fffffffffffffb20);
  Imath_3_2::Matrix44<double>::makeIdentity(&local_280);
  testWithTranslateRotateAndScale<float>(in_stack_fffffffffffffad0);
  Imath_3_2::Vec3<double>::Vec3(&local_2f8,0.4,6.0,10.0);
  Imath_3_2::Matrix44<double>::translate<double>(&local_280,&local_2f8);
  testWithTranslateRotateAndScale<float>(in_stack_fffffffffffffad0);
  Imath_3_2::Vec3<double>::Vec3(&local_310,3.141592653589793,0.0,0.0);
  Imath_3_2::Matrix44<double>::rotate<double>
            (in_stack_fffffffffffff950,
             (Vec3<double> *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
  testWithTranslateRotateAndScale<float>(in_stack_fffffffffffffad0);
  Imath_3_2::Vec3<double>::Vec3(&local_328,0.0,0.7853981633974483,0.0);
  Imath_3_2::Matrix44<double>::rotate<double>
            (in_stack_fffffffffffff950,
             (Vec3<double> *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
  testWithTranslateRotateAndScale<float>(in_stack_fffffffffffffad0);
  Imath_3_2::Vec3<double>::Vec3(&local_340,0.0,0.0,-2.356194490192345);
  Imath_3_2::Matrix44<double>::rotate<double>
            (in_stack_fffffffffffff950,
             (Vec3<double> *)CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948));
  testWithTranslateRotateAndScale<float>(in_stack_fffffffffffffad0);
  Imath_3_2::Vec3<double>::Vec3(&local_358,2.0,2.0,2.0);
  Imath_3_2::Matrix44<double>::scale<double>(&local_280,&local_358);
  testWithTranslateRotateAndScale<float>(in_stack_fffffffffffffad0);
  Imath_3_2::Vec3<double>::Vec3(&local_370,0.01,0.01,0.01);
  Imath_3_2::Matrix44<double>::scale<double>(&local_280,&local_370);
  testWithTranslateRotateAndScale<float>(in_stack_fffffffffffffad0);
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::vector
            ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)0x18d75a);
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::vector
            ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)0x18d767);
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::clear
            ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)0x18d774);
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::clear
            ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)0x18d781);
  for (local_3a8 = 0; local_3a8 < 4; local_3a8 = local_3a8 + 1) {
    local_698 = (float)(local_3a8 & 0x7fffffffffffffff) + (float)(local_3a8 & 0x7fffffffffffffff);
    if (-1 < (long)(local_3a8 * 2)) {
      local_698 = (float)(long)(local_3a8 * 2);
    }
    local_3ac = local_698 / 3.1415927;
    local_3b0 = 0x3f860a92;
    dVar2 = std::cos((double)(ulong)(uint)local_3ac);
    dVar3 = std::sin((double)(ulong)(uint)local_3ac);
    Imath_3_2::Vec3<float>::Vec3(&local_3bc,SUB84(dVar2,0),SUB84(dVar3,0),0.0);
    std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::push_back
              ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)
               in_stack_fffffffffffff850,in_stack_fffffffffffff848);
    dVar2 = std::cos((double)(ulong)(uint)(local_3ac + 1.0471976));
    a = SUB84(dVar2,0);
    dVar2 = std::sin((double)(ulong)(uint)(local_3ac + 1.0471976));
    Imath_3_2::Vec3<float>::Vec3(local_3d8,a,SUB84(dVar2,0),0.0);
    std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::push_back
              ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)
               in_stack_fffffffffffff850,in_stack_fffffffffffff848);
  }
  verifyProcrustes<float>(in_stack_000001c0,in_stack_000001b8);
  Imath_3_2::Rand48::Rand48
            ((Rand48 *)in_stack_fffffffffffff850,(unsigned_long)in_stack_fffffffffffff848);
  for (local_3e8 = 1; local_3e8 < 10; local_3e8 = local_3e8 + 1) {
    std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::clear
              ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)0x18d9b6)
    ;
    std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::clear
              ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)0x18d9c3)
    ;
    for (local_3f0 = 0; local_3f0 < local_3e8; local_3f0 = local_3f0 + 1) {
      dVar2 = Imath_3_2::Rand48::nextf((Rand48 *)0x18d9f2);
      dVar3 = Imath_3_2::Rand48::nextf((Rand48 *)0x18da20);
      in_stack_fffffffffffff920 = (M44d *)Imath_3_2::Rand48::nextf((Rand48 *)0x18da4e);
      Imath_3_2::Vec3<float>::Vec3
                (&local_3fc,(float)dVar2,(float)dVar3,(float)(double)in_stack_fffffffffffff920);
      std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::push_back
                ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)
                 in_stack_fffffffffffff850,in_stack_fffffffffffff848);
      dVar2 = Imath_3_2::Rand48::nextf((Rand48 *)0x18dab1);
      dVar3 = Imath_3_2::Rand48::nextf((Rand48 *)0x18dadf);
      dVar4 = Imath_3_2::Rand48::nextf((Rand48 *)0x18db0d);
      Imath_3_2::Vec3<float>::Vec3(&local_408,(float)dVar2,(float)dVar3,(float)dVar4);
      std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::push_back
                ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)
                 in_stack_fffffffffffff850,in_stack_fffffffffffff848);
    }
  }
  verifyProcrustes<float>(in_stack_000001c0,in_stack_000001b8);
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff920);
  Imath_3_2::Vec3<float>::Vec3(&local_414,3.0,4.0,1.0);
  Imath_3_2::Matrix44<double>::translate<float>(&local_280,&local_414);
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff920);
  Imath_3_2::Vec3<float>::Vec3(&local_420,-10.0,2.0,1.0);
  Imath_3_2::Matrix44<double>::translate<float>(&local_280,&local_420);
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff920);
  Imath_3_2::Euler<double>::Euler
            (in_stack_fffffffffffff880,in_stack_fffffffffffff878,in_stack_fffffffffffff870,
             in_stack_fffffffffffff868,(Order)((ulong)in_stack_fffffffffffff860 >> 0x20),
             (InputLayout)in_stack_fffffffffffff860);
  Imath_3_2::Euler<double>::toMatrix44(in_stack_fffffffffffff978);
  Imath_3_2::Matrix44<double>::operator*(in_stack_fffffffffffff858,in_stack_fffffffffffff850);
  Imath_3_2::Matrix44<double>::operator=(&local_280,&local_4c0);
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff920);
  Imath_3_2::Vec3<float>::Vec3(local_54c,1.5,6.4,2.0);
  Imath_3_2::Matrix44<double>::scale<float>(&local_280,local_54c);
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff920);
  Imath_3_2::Euler<double>::Euler
            (in_stack_fffffffffffff880,in_stack_fffffffffffff878,in_stack_fffffffffffff870,
             in_stack_fffffffffffff868,(Order)((ulong)in_stack_fffffffffffff860 >> 0x20),
             (InputLayout)in_stack_fffffffffffff860);
  Imath_3_2::Euler<double>::toMatrix44(in_stack_fffffffffffff978);
  v = &local_5f0;
  Imath_3_2::Matrix44<double>::operator*(in_stack_fffffffffffff858,in_stack_fffffffffffff850);
  Imath_3_2::Matrix44<double>::operator=(&local_280,v);
  pVVar5 = local_67c;
  Imath_3_2::Vec3<float>::Vec3(pVVar5,-1.0,1.0,1.0);
  Imath_3_2::Matrix44<double>::scale<float>(&local_280,pVVar5);
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff920);
  pVVar5 = (Vec3<float> *)&stack0xfffffffffffff978;
  Imath_3_2::Vec3<float>::Vec3(pVVar5,1.0,0.001,1.0);
  Imath_3_2::Matrix44<double>::scale<float>(&local_280,pVVar5);
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff920);
  this = &local_694;
  Imath_3_2::Vec3<float>::Vec3(this,1.0,1.0,0.0);
  Imath_3_2::Matrix44<double>::scale<float>(&local_280,this);
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff920);
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::~vector
            ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)pVVar5);
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::~vector
            ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)pVVar5);
  return;
}

Assistant:

void
testProcrustesImp ()
{
    // Test the empty case:
    IMATH_INTERNAL_NAMESPACE::M44d id = procrustesRotationAndTranslation (
        (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
        (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
        (T*) 0,
        0);
    assert (id == IMATH_INTERNAL_NAMESPACE::M44d ());

    id = procrustesRotationAndTranslation (
        (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
        (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
        0);
    assert (id == IMATH_INTERNAL_NAMESPACE::M44d ());

    // First we'll test with a bunch of known translation/rotation matrices
    // to make sure we get back exactly the same points:
    IMATH_INTERNAL_NAMESPACE::M44d m;
    m.makeIdentity ();
    testTranslationRotationMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::V3d (3.0, 5.0, -0.2));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d (M_PI, 0, 0));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d (0, M_PI / 4.0, 0));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d (0, 0, -3.0 / 4.0 * M_PI));
    testTranslationRotationMatrix<T> (m);

    m.makeIdentity ();
    testWithTranslateRotateAndScale<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::V3d (0.4, 6.0, 10.0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d (M_PI, 0, 0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d (0, M_PI / 4.0, 0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d (0, 0, -3.0 / 4.0 * M_PI));
    testWithTranslateRotateAndScale<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::V3d (2.0, 2.0, 2.0));
    testWithTranslateRotateAndScale<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::V3d (0.01, 0.01, 0.01));
    testWithTranslateRotateAndScale<T> (m);

    // Now we'll test with some random point sets and verify
    // the various Procrustes properties:
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>> fromPoints;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>> toPoints;
    fromPoints.clear ();
    toPoints.clear ();

    for (size_t i = 0; i < 4; ++i)
    {
        const T theta = T (2 * i) / T (M_PI);
        const T offset = T(M_PI / 3.0);
        fromPoints.push_back (
            IMATH_INTERNAL_NAMESPACE::Vec3<T> (cos (theta), sin (theta), 0));
        toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T> (
            cos (theta + offset), sin (theta + offset), 0));
    }
    verifyProcrustes (fromPoints, toPoints);

    IMATH_INTERNAL_NAMESPACE::Rand48 random (1209);
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        fromPoints.clear ();
        toPoints.clear ();
        for (size_t i = 0; i < numPoints; ++i)
        {
            fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T> (
                static_cast<T>(random.nextf ()),
                static_cast<T>(random.nextf ()),
                static_cast<T>(random.nextf ())));
            toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T> (
                static_cast<T>(random.nextf ()),
                static_cast<T>(random.nextf ()),
                static_cast<T>(random.nextf ())));
        }
    }
    verifyProcrustes (fromPoints, toPoints);

    // Test with some known matrices of varying degrees of quality:
    testProcrustesWithMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::Vec3<T> (3, 4, 1));
    testProcrustesWithMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::Vec3<T> (-10, 2, 1));
    testProcrustesWithMatrix<T> (m);

    IMATH_INTERNAL_NAMESPACE::Eulerd rot (M_PI / 3.0, 3.0 * M_PI / 4.0, 0);
    m = m * rot.toMatrix44 ();
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T> (T(1.5), T(6.4), T(2.0)));
    testProcrustesWithMatrix<T> (m);

    IMATH_INTERNAL_NAMESPACE::Eulerd rot2 (1.0, M_PI, M_PI / 3.0);
    m = m * rot.toMatrix44 ();

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T> (-1, 1, 1));
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T> (1, T(0.001), 1));
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T> (1, 1, 0));
    testProcrustesWithMatrix<T> (m);
}